

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Textures.cpp
# Opt level: O1

void __thiscall pbrt::SemanticParser::extractTextures(SemanticParser *this,SP *geom,SP *shape)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  param;
  undefined1 local_a8 [40];
  SemanticParser *local_80;
  _Base_ptr local_78;
  undefined1 local_70 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_60;
  
  peVar1 = (shape->super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var6 = *(_Base_ptr *)((long)&(peVar1->super_Node).super_ParamSet.param._M_t._M_impl + 0x18);
  p_Var7 = (_Base_ptr)((long)&(peVar1->super_Node).super_ParamSet.param._M_t._M_impl + 8);
  if (p_Var6 != p_Var7) {
    local_a8._32_8_ = geom;
    local_80 = this;
    local_78 = (_Base_ptr)shape;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_60,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var6 + 1));
      (**(local_60.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->_vptr_Param)(local_a8);
      iVar4 = std::__cxx11::string::compare(local_a8);
      if ((element_type *)local_a8._0_8_ != (element_type *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,(ulong)((long)(_func_int ***)local_a8._16_8_ + 1));
      }
      if (iVar4 == 0) {
        syntactic::ParamSet::getParamTexture((ParamSet *)local_70,(string *)(*(long *)local_78 + 8))
        ;
        findOrCreateTexture((SemanticParser *)local_a8,(SP *)local_80);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
                 ::operator[](&((__shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2> *)
                               local_a8._32_8_)->_M_ptr->textures,&local_60.first);
        uVar3 = local_a8._8_8_;
        uVar2 = local_a8._0_8_;
        local_a8._0_8_ = (element_type *)0x0;
        local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (pmVar5->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        (pmVar5->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)uVar2;
        (pmVar5->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        if ((_Base_ptr)local_70._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
      }
      if ((_Base_ptr)
          local_60.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
        operator_delete(local_60.first._M_dataplus._M_p,
                        local_60.first.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var7);
  }
  return;
}

Assistant:

void SemanticParser::extractTextures(Shape::SP geom, pbrt::syntactic::Shape::SP shape)
  {
    for (auto param : shape->param) {
      if (param.second->getType() != "texture")
        continue;

      geom->textures[param.first] = findOrCreateTexture(shape->getParamTexture(param.first));//param.second);
    }
  }